

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O2

int __thiscall gdsForge::GDSwriteBitArr(gdsForge *this,int record,bitset<16UL> inBits)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  byte local_1e;
  byte local_1d;
  uchar OHout [4];
  
  if ((char)record == '\x01') {
    OHout[0] = '\0';
    OHout[1] = '\x06';
    OHout[2] = (uchar)((uint)record >> 8);
    OHout[3] = '\x01';
    fwrite(OHout,1,4,(FILE *)this->gdsFile);
    local_1e = 0;
    for (uVar3 = 0xf; 7 < uVar3; uVar3 = uVar3 - 1) {
      local_1e = local_1e |
                 (((ulong)inBits.super__Base_bitset<1UL>._M_w >> (uVar3 & 0x3f) & 1) != 0) <<
                 ((char)uVar3 - 8U & 0x1f);
    }
    local_1d = 0;
    uVar3 = 8;
    while (uVar3 != 0) {
      local_1d = local_1d |
                 (((ulong)inBits.super__Base_bitset<1UL>._M_w >> (uVar3 & 0x3f) & 1) != 0) <<
                 ((byte)uVar3 & 0x1f);
      uVar3 = uVar3 - 1;
    }
    fwrite(&local_1e,1,2,(FILE *)this->gdsFile);
    iVar1 = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Incorrect record: 0x");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,record);
    std::endl<char,std::char_traits<char>>(poVar2);
    *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                  *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int gdsForge::GDSwriteBitArr(int record, bitset<16> inBits)
{
  if ((record & 0xff) != 0x01) {
    cout << "Incorrect record: 0x" << hex << record << endl;
    cout << dec;
    return 1;
  }
  unsigned char OHout[4];

  OHout[0] = 0 & 0xff;
  OHout[1] = (2 + 4) & 0xff;
  OHout[2] = record >> 8 & 0xff;
  OHout[3] = record & 0xff;
  fwrite(OHout, 1, 4, this->gdsFile);

  unsigned char dataOut[2] = {0, 0};

  for (int i = 15; i >= 8; i--) {
    dataOut[0] = dataOut[0] | (inBits[i] << (i - 8));
  }
  for (int i = 8; i > 0; i--) {
    dataOut[1] = dataOut[1] | (inBits[i] << i);
  }

  fwrite(dataOut, 1, 2, this->gdsFile);

  return 0;
}